

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upnp.cpp
# Opt level: O0

void __thiscall
libtorrent::upnp::on_upnp_get_ip_address_response
          (upnp *this,error_code *e,http_parser *p,rootdevice *d,http_connection *c)

{
  bool bVar1;
  int iVar2;
  element_type *peVar3;
  element_type *this_00;
  char *pcVar4;
  size_type __len;
  ulong uVar5;
  function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
  *callback;
  double __x;
  double dVar6;
  double __x_00;
  double __x_01;
  string_view input;
  span<const_char> sVar7;
  bool local_179;
  port_mapping_t local_16c;
  address local_168;
  ip_address_parse_state *local_148;
  code *local_140;
  _Bind<void_(*(std::_Placeholder<1>,_std::_Placeholder<2>,_std::reference_wrapper<libtorrent::ip_address_parse_state>))(int,_std::basic_string_view<char,_std::char_traits<char>_>,_libtorrent::ip_address_parse_state_&)>
  local_138;
  function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
  local_128;
  basic_string_view<char,_std::char_traits<char>_> local_108;
  undefined1 local_f8 [8];
  ip_address_parse_state s;
  string local_c0 [32];
  undefined1 local_a0 [8];
  span<const_char> body;
  port_mapping_t local_88;
  port_mapping_t local_84;
  string local_80;
  error_code local_60;
  undefined4 local_50;
  undefined1 local_40 [8];
  shared_ptr<libtorrent::upnp> me;
  http_connection *c_local;
  rootdevice *d_local;
  http_parser *p_local;
  error_code *e_local;
  upnp *this_local;
  
  me.super___shared_ptr<libtorrent::upnp,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)c;
  self((upnp *)local_40);
  bVar1 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&d->upnp_connection);
  if ((bVar1) &&
     (peVar3 = ::std::__shared_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2>::
               get(&(d->upnp_connection).
                    super___shared_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2>
                  ),
     peVar3 == (element_type *)
               me.super___shared_ptr<libtorrent::upnp,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
     )) {
    this_00 = ::std::
              __shared_ptr_access<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&d->upnp_connection);
    libtorrent::aux::http_connection::close(this_00,0);
    ::std::__shared_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2>::reset
              (&(d->upnp_connection).
                super___shared_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2>);
  }
  if ((this->m_closing & 1U) == 0) {
    bVar1 = boost::system::error_code::operator_cast_to_bool(e);
    local_179 = false;
    if (bVar1) {
      boost::system::error_code::error_code<boost::asio::error::misc_errors>
                (&local_60,eof,(type *)0x0);
      local_179 = boost::system::operator!=(e,&local_60);
    }
    if (local_179 == false) {
      bVar1 = libtorrent::aux::http_parser::header_finished(p);
      if (bVar1) {
        iVar2 = libtorrent::aux::http_parser::status_code(p);
        if (iVar2 == 200) {
          sVar7 = libtorrent::aux::http_parser::get_body(p);
          body.m_ptr = (char *)sVar7.m_len;
          local_a0 = (undefined1  [8])sVar7.m_ptr;
          bVar1 = should_log(this);
          if (bVar1) {
            pcVar4 = span<const_char>::data((span<const_char> *)local_a0);
            uVar5 = span<const_char>::size((span<const_char> *)local_a0);
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      (local_c0,pcVar4,uVar5,(allocator *)(s.ip_address.field_2._M_local_buf + 0xf))
            ;
            dVar6 = (double)::std::__cxx11::string::c_str();
            log(this,dVar6);
            ::std::__cxx11::string::~string(local_c0);
            ::std::allocator<char>::~allocator
                      ((allocator<char> *)(s.ip_address.field_2._M_local_buf + 0xf));
          }
          ip_address_parse_state::ip_address_parse_state((ip_address_parse_state *)local_f8);
          pcVar4 = span<const_char>::data((span<const_char> *)local_a0);
          __len = span<const_char>::size((span<const_char> *)local_a0);
          ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (&local_108,pcVar4,__len);
          local_140 = find_ip_address;
          local_148 = (ip_address_parse_state *)
                      ::std::ref<libtorrent::ip_address_parse_state>
                                ((ip_address_parse_state *)local_f8);
          callback = (function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                      *)&::std::placeholders::_2;
          ::std::
          bind<void(*)(int,std::basic_string_view<char,std::char_traits<char>>,libtorrent::ip_address_parse_state&),std::_Placeholder<1>const&,std::_Placeholder<2>const&,std::reference_wrapper<libtorrent::ip_address_parse_state>>
                    (&local_138._M_f,(_Placeholder<1> *)&local_140,
                     (_Placeholder<2> *)&::std::placeholders::_1,
                     (reference_wrapper<libtorrent::ip_address_parse_state> *)
                     &::std::placeholders::_2);
          ::std::
          function<void(int,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>)>
          ::
          function<std::_Bind<void(*(std::_Placeholder<1>,std::_Placeholder<2>,std::reference_wrapper<libtorrent::ip_address_parse_state>))(int,std::basic_string_view<char,std::char_traits<char>>,libtorrent::ip_address_parse_state&)>,void>
                    ((function<void(int,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>)>
                      *)&local_128,&local_138);
          input._M_str = (char *)&local_128;
          input._M_len = (size_t)local_108._M_str;
          libtorrent::aux::xml_parse((aux *)local_108._M_len,input,callback);
          ::std::
          function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
          ::~function(&local_128);
          if (local_f8._4_4_ != -1) {
            log(this,__x_00);
          }
          uVar5 = ::std::__cxx11::string::empty();
          if ((uVar5 & 1) == 0) {
            dVar6 = (double)::std::__cxx11::string::c_str();
            log(this,dVar6);
            pcVar4 = (char *)::std::__cxx11::string::c_str();
            boost::asio::ip::make_address(&local_168,pcVar4,(error_code *)ignore_error);
            boost::asio::ip::address::operator=(&(d->external_ip).super_address,&local_168);
          }
          else {
            log(this,__x_01);
          }
          iVar2 = num_mappings(this);
          if (0 < iVar2) {
            libtorrent::aux::strong_typedef<int,_libtorrent::port_mapping_tag,_void>::strong_typedef
                      (&local_16c,0);
            update_map(this,d,local_16c);
          }
          ip_address_parse_state::~ip_address_parse_state((ip_address_parse_state *)local_f8);
          local_50 = 0;
        }
        else {
          bVar1 = should_log(this);
          if (bVar1) {
            libtorrent::aux::http_parser::message_abi_cxx11_(p);
            dVar6 = (double)::std::__cxx11::string::c_str();
            log(this,dVar6);
          }
          iVar2 = num_mappings(this);
          if (0 < iVar2) {
            libtorrent::aux::strong_typedef<int,_libtorrent::port_mapping_tag,_void>::strong_typedef
                      ((strong_typedef<int,_libtorrent::port_mapping_tag,_void> *)
                       ((long)&body.m_len + 4),0);
            update_map(this,d,body.m_len._4_4_);
          }
          local_50 = 1;
        }
      }
      else {
        log(this,__x);
        iVar2 = num_mappings(this);
        if (0 < iVar2) {
          libtorrent::aux::strong_typedef<int,_libtorrent::port_mapping_tag,_void>::strong_typedef
                    (&local_88,0);
          update_map(this,d,local_88);
        }
        local_50 = 1;
      }
    }
    else {
      bVar1 = should_log(this);
      if (bVar1) {
        boost::system::error_code::message_abi_cxx11_(&local_80,e);
        dVar6 = (double)::std::__cxx11::string::c_str();
        log(this,dVar6);
        ::std::__cxx11::string::~string((string *)&local_80);
      }
      iVar2 = num_mappings(this);
      if (0 < iVar2) {
        libtorrent::aux::strong_typedef<int,_libtorrent::port_mapping_tag,_void>::strong_typedef
                  (&local_84,0);
        update_map(this,d,local_84);
      }
      local_50 = 1;
    }
  }
  else {
    local_50 = 1;
  }
  ::std::shared_ptr<libtorrent::upnp>::~shared_ptr((shared_ptr<libtorrent::upnp> *)local_40);
  return;
}

Assistant:

void upnp::on_upnp_get_ip_address_response(error_code const& e
	, aux::http_parser const& p, rootdevice& d
	, http_connection& c)
{
	TORRENT_ASSERT(is_single_thread());
	std::shared_ptr<upnp> me(self());

	TORRENT_ASSERT(d.magic == 1337);
	if (d.upnp_connection && d.upnp_connection.get() == &c)
	{
		d.upnp_connection->close();
		d.upnp_connection.reset();
	}

	if (m_closing) return;

	if (e && e != boost::asio::error::eof)
	{
#ifndef TORRENT_DISABLE_LOGGING
		if (should_log())
		{
			log("error while getting external IP address: %s"
				, e.message().c_str());
		}
#endif
		if (num_mappings() > 0) update_map(d, port_mapping_t{0});
		return;
	}

	if (!p.header_finished())
	{
#ifndef TORRENT_DISABLE_LOGGING
		log("error while getting external IP address: incomplete http message");
#endif
		if (num_mappings() > 0) update_map(d, port_mapping_t{0});
		return;
	}

	if (p.status_code() != 200)
	{
#ifndef TORRENT_DISABLE_LOGGING
		if (should_log())
		{
			log("error while getting external IP address: %s"
				, p.message().c_str());
		}
#endif
		if (num_mappings() > 0) update_map(d, port_mapping_t{0});
		return;
	}

	// response may look like
	// <?xml version="1.0"?>
	// <s:Envelope xmlns:s="http://schemas.xmlsoap.org/soap/envelope/" s:encodingStyle="http://schemas.xmlsoap.org/soap/encoding/">
	// <s:Body><u:GetExternalIPAddressResponse xmlns:u="urn:schemas-upnp-org:service:WANIPConnection:1">
	// <NewExternalIPAddress>192.168.160.19</NewExternalIPAddress>
	// </u:GetExternalIPAddressResponse>
	// </s:Body>
	// </s:Envelope>

	span<char const> body = p.get_body();
#ifndef TORRENT_DISABLE_LOGGING
	if (should_log())
	{
		log("get external IP address response: %s"
			, std::string(body.data(), static_cast<std::size_t>(body.size())).c_str());
	}
#endif

	ip_address_parse_state s;
	xml_parse({body.data(), std::size_t(body.size())}, std::bind(&find_ip_address, _1, _2, std::ref(s)));
#ifndef TORRENT_DISABLE_LOGGING
	if (s.error_code != -1)
	{
		log("error while getting external IP address, code: %d", s.error_code);
	}
#endif

	if (!s.ip_address.empty())
	{
#ifndef TORRENT_DISABLE_LOGGING
		log("got router external IP address %s", s.ip_address.c_str());
#endif
		d.external_ip = make_address(s.ip_address.c_str(), ignore_error);
	}
	else
	{
#ifndef TORRENT_DISABLE_LOGGING
		log("failed to find external IP address in response");
#endif
	}

	if (num_mappings() > 0) update_map(d, port_mapping_t{0});
}